

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_CorrelationMeter.cpp
# Opt level: O2

int CorrelationMeter::CreateCallback(UnityAudioEffectState *state)

{
  EffectData *this;
  long lVar1;
  
  this = (EffectData *)operator_new(0x90);
  EffectData::EffectData(this);
  memset(this,0,0x90);
  InitParametersFromDefinitions(InternalRegisterEffectDefinition,(float *)this);
  (state->field_0).field_0.effectdata = this;
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x10) {
    HistoryBuffer::Init((HistoryBuffer *)((long)this->p + lVar1 + 8),
                        (state->field_0).field_0.samplerate * 2);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK CreateCallback(UnityAudioEffectState* state)
    {
        EffectData* data = new EffectData;
        memset(data, 0, sizeof(EffectData));
        InitParametersFromDefinitions(InternalRegisterEffectDefinition, data->p);
        state->effectdata = data;
        for (int i = 0; i < 8; i++)
            data->history[i].Init(state->samplerate * 2);
        return UNITY_AUDIODSP_OK;
    }